

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::ReverseCopyProp(BackwardPass *this,Instr *instr)

{
  OpCode OVar1;
  StackSym *this_00;
  code *pcVar2;
  CopyPropSyms *this_01;
  bool bVar3;
  BOOLEAN BVar4;
  ValueType valueType;
  uint sourceContextId;
  uint functionId;
  BOOL BVar5;
  BVIndex BVar6;
  uint32 uVar7;
  BailOutKind BVar8;
  Opnd *pOVar9;
  RegOpnd *opnd;
  RegOpnd *opnd_00;
  BVSparse<Memory::JitArenaAllocator> *this_02;
  Opnd *pOVar10;
  BailOutInfo *pBVar11;
  undefined4 *puVar12;
  Type_conflict node;
  Type *this_03;
  StackSym *pSVar13;
  RegOpnd *pRVar14;
  CopyPropSyms *usedCopyPropSym;
  Iterator __iter;
  StackSym *prevDstSym;
  StackSym *dstSym;
  BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed;
  StackSym *varSym;
  ByteCodeUsesInstr *byteCodeUseInstr;
  Instr *instrPrev;
  RegOpnd *src;
  RegOpnd *dst;
  Instr *instr_local;
  BackwardPass *this_local;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ReverseCopyPropPhase,sourceContextId,functionId);
  if (bVar3) {
    return false;
  }
  if (((this->tag != DeadStorePhase) || (bVar3 = IsPrePass(this), bVar3)) ||
     (bVar3 = IsCollectionPass(this), bVar3)) {
    return false;
  }
  BVar5 = Func::HasTry(this->func);
  if (BVar5 != 0) {
    return false;
  }
  if ((instr->m_opcode != Ld_A) && (instr->m_opcode != Ld_I4)) {
    return false;
  }
  pOVar9 = IR::Instr::GetDst(instr);
  bVar3 = IR::Opnd::IsRegOpnd(pOVar9);
  if (!bVar3) {
    return false;
  }
  pOVar9 = IR::Instr::GetSrc1(instr);
  bVar3 = IR::Opnd::IsRegOpnd(pOVar9);
  if (!bVar3) {
    return false;
  }
  bVar3 = IR::Instr::HasBailOutInfo(instr);
  if (bVar3) {
    return false;
  }
  pOVar9 = IR::Instr::GetDst(instr);
  opnd = IR::Opnd::AsRegOpnd(pOVar9);
  pOVar9 = IR::Instr::GetSrc1(instr);
  opnd_00 = IR::Opnd::AsRegOpnd(pOVar9);
  byteCodeUseInstr = (ByteCodeUsesInstr *)IR::Instr::GetPrevRealInstrOrLabel(instr);
  varSym = (StackSym *)0x0;
  byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)opnd_00->m_sym;
  bVar3 = StackSym::IsTypeSpec((StackSym *)byteCodeUpwardExposedUsed);
  if (bVar3) {
    byteCodeUpwardExposedUsed =
         (BVSparse<Memory::JitArenaAllocator> *)
         StackSym::GetVarEquivSym((StackSym *)byteCodeUpwardExposedUsed,this->func);
  }
  pOVar9 = IR::Instr::GetDst((Instr *)byteCodeUseInstr);
  if (pOVar9 == (Opnd *)0x0) {
    if ((byteCodeUseInstr->super_Instr).m_opcode != ByteCodeUses) {
      return false;
    }
    varSym = (StackSym *)IR::Instr::AsByteCodeUsesInstr((Instr *)byteCodeUseInstr);
    this_02 = IR::ByteCodeUsesInstr::GetByteCodeUpwardExposedUsed((ByteCodeUsesInstr *)varSym);
    if (((this_02 == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
        (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                           (this_02,*(BVIndex *)&byteCodeUpwardExposedUsed->alloc), BVar4 == '\0'))
       || (BVar6 = BVSparse<Memory::JitArenaAllocator>::Count(this_02), BVar6 != 1)) {
      return false;
    }
    byteCodeUseInstr = (ByteCodeUsesInstr *)IR::Instr::GetPrevRealInstrOrLabel((Instr *)varSym);
    pOVar9 = IR::Instr::GetDst((Instr *)byteCodeUseInstr);
    if (pOVar9 == (Opnd *)0x0) {
      return false;
    }
  }
  OVar1 = (byteCodeUseInstr->super_Instr).m_opcode;
  if (((OVar1 == LdElemI_A) || (OVar1 == IsInst)) || (OVar1 == ByteCodeUses)) {
    return false;
  }
  bVar3 = IR::Instr::HasBailOutInfo(&byteCodeUseInstr->super_Instr);
  if (bVar3) {
    uVar7 = IR::Instr::GetByteCodeOffset(&byteCodeUseInstr->super_Instr);
    pBVar11 = IR::Instr::GetBailOutInfo(&byteCodeUseInstr->super_Instr);
    if (uVar7 != pBVar11->bailOutOffset) {
      return false;
    }
  }
  pOVar9 = IR::Instr::GetDst(&byteCodeUseInstr->super_Instr);
  bVar3 = IR::Opnd::IsEqual(pOVar9,&opnd_00->super_Opnd);
  if (!bVar3) {
    return false;
  }
  BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                    (this->currentBlock->upwardExposedUses,(opnd_00->m_sym->super_Sym).m_id);
  if (BVar4 != '\0') {
    return false;
  }
  if ((this->currentBlock->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0)
     && (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                           (this->currentBlock->byteCodeUpwardExposedUsed,
                            *(BVIndex *)&byteCodeUpwardExposedUsed->alloc), BVar4 != '\0')) {
    return false;
  }
  bVar3 = DoDeadStore(this->func,opnd_00->m_sym);
  if (!bVar3) {
    return false;
  }
  this_00 = opnd->m_sym;
  bVar3 = IR::Instr::HasBailOutInfo(&byteCodeUseInstr->super_Instr);
  if (((bVar3) && (bVar3 = StackSym::IsInt32(this_00), bVar3)) &&
     (bVar3 = StackSym::IsTypeSpec(this_00), bVar3)) {
    pOVar9 = IR::Instr::GetDst(&byteCodeUseInstr->super_Instr);
    __iter.current = (NodeBase *)IR::RegOpnd::TryGetStackSym(pOVar9);
    BVar8 = IR::Instr::GetBailOutKind(&byteCodeUseInstr->super_Instr);
    BVar8 = IR::operator&(BVar8,BailOutOnResultConditions);
    if ((((BVar8 != BailOutInvalid) && (__iter.current != (NodeBase *)0x0)) &&
        (bVar3 = StackSym::IsInt32((StackSym *)__iter.current), bVar3)) &&
       ((bVar3 = StackSym::IsTypeSpec((StackSym *)__iter.current), bVar3 &&
        (pOVar9 = IR::Instr::GetSrc1(&byteCodeUseInstr->super_Instr), pOVar9 != (Opnd *)0x0)))) {
      pOVar9 = IR::Instr::GetDst(&byteCodeUseInstr->super_Instr);
      pOVar10 = IR::Instr::GetSrc1(&byteCodeUseInstr->super_Instr);
      bVar3 = IR::Opnd::IsEqual(pOVar9,pOVar10);
      if (!bVar3) {
        pOVar9 = IR::Instr::GetSrc2(&byteCodeUseInstr->super_Instr);
        if (pOVar9 != (Opnd *)0x0) {
          pOVar9 = IR::Instr::GetDst(&byteCodeUseInstr->super_Instr);
          pOVar10 = IR::Instr::GetSrc2(&byteCodeUseInstr->super_Instr);
          bVar3 = IR::Opnd::IsEqual(pOVar9,pOVar10);
          if (bVar3) goto LAB_004d5132;
        }
        pBVar11 = IR::Instr::GetBailOutInfo(&byteCodeUseInstr->super_Instr);
        _usedCopyPropSym =
             SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             ::GetIterator(&pBVar11->usedCapturedValues->copyPropSyms);
        while( true ) {
          if (__iter.list ==
              (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          this_01 = usedCopyPropSym;
          node = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
          bVar3 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                            *)this_01,node);
          if (bVar3) break;
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
          this_03 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&usedCopyPropSym);
          pSVar13 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Value(this_03);
          if (this_00 == pSVar13) {
            return false;
          }
        }
      }
    }
  }
LAB_004d5132:
  if (varSym == (StackSym *)0x0) {
    pOVar9 = IR::Instr::GetDst(&byteCodeUseInstr->super_Instr);
    pRVar14 = IR::Opnd::AsRegOpnd(pOVar9);
    bVar3 = IR::Opnd::GetIsJITOptimizedReg(&pRVar14->super_Opnd);
    if (((bVar3) && (bVar3 = IR::Opnd::GetIsJITOptimizedReg(&opnd_00->super_Opnd), !bVar3)) &&
       (bVar3 = StackSym::HasByteCodeRegSlot((StackSym *)byteCodeUpwardExposedUsed), bVar3)) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->byteCodeUpwardExposedUsed,
                 *(BVIndex *)&byteCodeUpwardExposedUsed->alloc);
    }
  }
  else {
    if (this->currentBlock->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0)
    {
      pOVar9 = IR::Instr::GetDst(&byteCodeUseInstr->super_Instr);
      pRVar14 = IR::Opnd::AsRegOpnd(pOVar9);
      bVar3 = IR::Opnd::GetIsJITOptimizedReg(&pRVar14->super_Opnd);
      if ((bVar3) &&
         (bVar3 = StackSym::HasByteCodeRegSlot((StackSym *)byteCodeUpwardExposedUsed), bVar3)) {
        bVar3 = StackSym::HasByteCodeRegSlot((StackSym *)byteCodeUpwardExposedUsed);
        if (bVar3) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->currentBlock->byteCodeUpwardExposedUsed,
                     *(BVIndex *)&byteCodeUpwardExposedUsed->alloc);
        }
        bVar3 = IR::Opnd::IsEqual(&opnd_00->super_Opnd,&opnd->super_Opnd);
        if (bVar3) {
          pOVar9 = IR::Instr::GetDst(&byteCodeUseInstr->super_Instr);
          bVar3 = IR::Opnd::GetIsJITOptimizedReg(pOVar9);
          if (bVar3) {
            IR::Opnd::SetIsJITOptimizedReg(&opnd->super_Opnd,true);
          }
        }
      }
    }
    IR::Instr::Remove((Instr *)varSym);
  }
  bVar3 = DoMarkTempObjectVerify(this);
  if (bVar3) {
    ObjectTempVerify::NotifyReverseCopyProp
              (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,
               &byteCodeUseInstr->super_Instr);
  }
  pOVar9 = IR::Instr::GetDst(&byteCodeUseInstr->super_Instr);
  valueType = IR::Opnd::GetValueType(pOVar9);
  IR::Opnd::SetValueType(&opnd->super_Opnd,valueType);
  IR::Instr::ReplaceDst(&byteCodeUseInstr->super_Instr,&opnd->super_Opnd);
  IR::Instr::Remove(instr);
  return true;
}

Assistant:

bool
BackwardPass::ReverseCopyProp(IR::Instr *instr)
{
    // Look for :
    //
    //  t1 = instr
    //       [bytecodeuse t1]
    //  t2 = Ld_A t1            >> t1 !upwardExposed
    //
    // Transform into:
    //
    //  t2 = instr
    //
    if (PHASE_OFF(Js::ReverseCopyPropPhase, this->func))
    {
        return false;
    }
    if (this->tag != Js::DeadStorePhase || this->IsPrePass() || this->IsCollectionPass())
    {
        return false;
    }
    if (this->func->HasTry())
    {
        // UpwardExposedUsed info can't be relied on
        return false;
    }

    // Find t2 = Ld_A t1
    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
        break;

    default:
        return false;
    }

    if (!instr->GetDst()->IsRegOpnd())
    {
        return false;
    }
    if (!instr->GetSrc1()->IsRegOpnd())
    {
        return false;
    }
    if (instr->HasBailOutInfo())
    {
        return false;
    }

    IR::RegOpnd *dst = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *src = instr->GetSrc1()->AsRegOpnd();
    IR::Instr *instrPrev = instr->GetPrevRealInstrOrLabel();

    IR::ByteCodeUsesInstr *byteCodeUseInstr = nullptr;
    StackSym *varSym = src->m_sym;

    if (varSym->IsTypeSpec())
    {
        varSym = varSym->GetVarEquivSym(this->func);
    }

    // SKip ByteCodeUse instr if possible
    //       [bytecodeuse t1]
    if (!instrPrev->GetDst())
    {
        if (instrPrev->m_opcode == Js::OpCode::ByteCodeUses)
        {
            byteCodeUseInstr = instrPrev->AsByteCodeUsesInstr();
            const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = byteCodeUseInstr->GetByteCodeUpwardExposedUsed();
            if (byteCodeUpwardExposedUsed && byteCodeUpwardExposedUsed->Test(varSym->m_id) && byteCodeUpwardExposedUsed->Count() == 1)
            {
                instrPrev = byteCodeUseInstr->GetPrevRealInstrOrLabel();

                if (!instrPrev->GetDst())
                {
                    return false;
                }
            }
            else
            {
                return false;
            }
        }
        else
        {
            return false;
        }
    }

    // The fast-path for these doesn't handle dst == src.
    // REVIEW: I believe the fast-path for LdElemI_A has been fixed... Nope, still broken for "i = A[i]" for prejit
    switch (instrPrev->m_opcode)
    {
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::IsInst:
    case Js::OpCode::ByteCodeUses:
        return false;
    }

    // Can't do it if post-op bailout would need result
    // REVIEW: enable for pre-opt bailout?
    if (instrPrev->HasBailOutInfo() && instrPrev->GetByteCodeOffset() != instrPrev->GetBailOutInfo()->bailOutOffset)
    {
        return false;
    }

    // Make sure src of Ld_A == dst of instr
    //  t1 = instr
    if (!instrPrev->GetDst()->IsEqual(src))
    {
        return false;
    }

    // Make sure t1 isn't used later
    if (this->currentBlock->upwardExposedUses->Test(src->m_sym->m_id))
    {
        return false;
    }

    if (this->currentBlock->byteCodeUpwardExposedUsed && this->currentBlock->byteCodeUpwardExposedUsed->Test(varSym->m_id))
    {
        return false;
    }

    // Make sure we can dead-store this sym (debugger mode?)
    if (!this->DoDeadStore(this->func, src->m_sym))
    {
        return false;
    }

    StackSym *const dstSym = dst->m_sym;
    if(instrPrev->HasBailOutInfo() && dstSym->IsInt32() && dstSym->IsTypeSpec())
    {
        StackSym *const prevDstSym = IR::RegOpnd::TryGetStackSym(instrPrev->GetDst());
        if(instrPrev->GetBailOutKind() & IR::BailOutOnResultConditions &&
            prevDstSym &&
            prevDstSym->IsInt32() &&
            prevDstSym->IsTypeSpec() &&
            instrPrev->GetSrc1() &&
            !instrPrev->GetDst()->IsEqual(instrPrev->GetSrc1()) &&
            !(instrPrev->GetSrc2() && instrPrev->GetDst()->IsEqual(instrPrev->GetSrc2())))
        {
            // The previous instruction's dst value may be trashed by the time of the pre-op bailout. Skip reverse copy-prop if
            // it would replace the previous instruction's dst with a sym that bailout had decided to use to restore a value for
            // the pre-op bailout, which can't be trashed before bailout. See big comment in ProcessBailOutCopyProps for the
            // reasoning behind the tests above.
            FOREACH_SLISTBASE_ENTRY(
                CopyPropSyms,
                usedCopyPropSym,
                &instrPrev->GetBailOutInfo()->usedCapturedValues->copyPropSyms)
            {
                if(dstSym == usedCopyPropSym.Value())
                {
                    return false;
                }
            } NEXT_SLISTBASE_ENTRY;
        }
    }

    if (byteCodeUseInstr)
    {
        if (this->currentBlock->byteCodeUpwardExposedUsed && instrPrev->GetDst()->AsRegOpnd()->GetIsJITOptimizedReg() && varSym->HasByteCodeRegSlot())
        {
            if(varSym->HasByteCodeRegSlot())
            {
                this->currentBlock->byteCodeUpwardExposedUsed->Set(varSym->m_id);
            }

            if (src->IsEqual(dst) && instrPrev->GetDst()->GetIsJITOptimizedReg())
            {
                //      s2(s1).i32     =  FromVar        s1.var      #0000  Bailout: #0000 (BailOutIntOnly)
                //                        ByteCodeUses   s1
                //      s2(s1).i32     =  Ld_A           s2(s1).i32
                //
                // Since the dst on the FromVar is marked JITOptimized, we need to set it on the new dst as well,
                // or we'll change the bytecode liveness of s1

                dst->SetIsJITOptimizedReg(true);
            }
        }
        byteCodeUseInstr->Remove();
    }
    else if (instrPrev->GetDst()->AsRegOpnd()->GetIsJITOptimizedReg() && !src->GetIsJITOptimizedReg() && varSym->HasByteCodeRegSlot())
    {
        this->currentBlock->byteCodeUpwardExposedUsed->Set(varSym->m_id);
    }

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        this->currentBlock->tempObjectVerifyTracker->NotifyReverseCopyProp(instrPrev);
    }
#endif

    dst->SetValueType(instrPrev->GetDst()->GetValueType());
    instrPrev->ReplaceDst(dst);

    instr->Remove();

    return true;
}